

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O3

void __thiscall Samba::writeXmodem(Samba *this,uint8_t *buffer,int size)

{
  byte *pbVar1;
  SerialPort *pSVar2;
  bool bVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  undefined8 *puVar7;
  uint uVar8;
  ulong uVar9;
  size_t __n;
  byte bVar10;
  int iVar11;
  ulong uVar12;
  uint8_t blk [133];
  byte local_b8 [131];
  undefined1 local_35;
  undefined1 local_34;
  
  iVar11 = 5;
  do {
    iVar5 = (*((this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[7])();
    if (iVar5 == 0x43) {
      if (iVar11 != 0) {
        if (0 < size) {
          bVar10 = 1;
          uVar12 = (ulong)(uint)size;
          do {
            local_b8[0] = 1;
            local_b8[2] = ~bVar10;
            __n = 0x80;
            if ((uint)uVar12 < 0x80) {
              __n = uVar12 & 0xffffffff;
            }
            local_b8[1] = bVar10;
            memcpy(local_b8 + 3,buffer,__n);
            if (uVar12 < 0x80) {
              memset(local_b8 + uVar12 + 3,0,0x80 - uVar12);
            }
            lVar6 = 3;
            uVar9 = 0;
            do {
              uVar4 = uVar9 >> 8;
              pbVar1 = local_b8 + lVar6;
              lVar6 = lVar6 + 1;
              uVar8 = (int)uVar9 << 8 ^ (uint)crc16Table[(uint)*pbVar1 ^ (uint)uVar4 & 0xff];
              uVar9 = (ulong)uVar8;
            } while (lVar6 != 0x83);
            local_35 = (undefined1)(uVar8 >> 8);
            local_34 = (undefined1)crc16Table[(uint)*pbVar1 ^ (uint)uVar4 & 0xff];
            iVar11 = 5;
            while( true ) {
              pSVar2 = (this->_port)._M_t.
                       super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
                       super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
                       super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
              iVar5 = (*pSVar2->_vptr_SerialPort[6])(pSVar2,local_b8,0x85);
              if (iVar5 != 0x85) goto LAB_0010c251;
              iVar5 = (*((this->_port)._M_t.
                         super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
                         super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
                         super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort
                        [7])();
              if (iVar5 == 6) break;
              iVar11 = iVar11 + -1;
              if (iVar11 == 0) goto LAB_0010c251;
            }
            buffer = buffer + 0x80;
            bVar10 = bVar10 + 1;
            bVar3 = 0x80 < (long)uVar12;
            uVar12 = uVar12 - 0x80;
          } while (bVar3);
        }
        iVar11 = 5;
        do {
          pSVar2 = (this->_port)._M_t.
                   super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
                   super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
                   super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
          (*pSVar2->_vptr_SerialPort[8])(pSVar2,4);
          iVar5 = (*((this->_port)._M_t.
                     super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
                     super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
                     super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[7])
                            ();
          if (iVar5 == 6) {
            return;
          }
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      break;
    }
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
LAB_0010c251:
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = &PTR__exception_001185a0;
  __cxa_throw(puVar7,&SambaError::typeinfo,std::exception::~exception);
}

Assistant:

void
Samba::writeXmodem(const uint8_t* buffer, int size)
{
    uint8_t blk[BLK_SIZE + 5];
    uint32_t blkNum = 1;
    int retries;
    int bytes;

    for (retries = 0; retries < MAX_RETRIES; retries++)
    {
        if (_port->get() == START)
            break;
    }
    if (retries == MAX_RETRIES)
        throw SambaError();

    while (size > 0)
    {
        blk[0] = SOH;
        blk[1] = (blkNum & 0xff);
        blk[2] = ~(blkNum & 0xff);
        memmove(&blk[3], buffer, min(size, BLK_SIZE));
        if (size < BLK_SIZE)
            memset(&blk[3] + size, 0, BLK_SIZE - size);
        crc16Add(blk);

        for (retries = 0; retries < MAX_RETRIES; retries++)
        {
            bytes = _port->write(blk, sizeof(blk));
            if (bytes != sizeof(blk))
                throw SambaError();

            if (_port->get() == ACK)
                break;
        }

        if (retries == MAX_RETRIES)
            throw SambaError();

        buffer += BLK_SIZE;
        size -= BLK_SIZE;
        blkNum++;
    }

    for (retries = 0; retries < MAX_RETRIES; retries++)
    {
        _port->put(EOT);
        if (_port->get() == ACK)
            break;
    }
    if (retries == MAX_RETRIES)
        throw SambaError();
}